

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vx-sound.c
# Opt level: O0

void VxSndLoadSound(char *filename,AudioSource *source)

{
  int iVar1;
  undefined4 *in_RSI;
  undefined8 in_RDI;
  ALuint buffer;
  float lengthSeconds;
  int alFormat;
  int channels;
  int sampleRate;
  uint32_t size;
  mp3dec_file_info_t info;
  undefined4 local_48;
  float local_44;
  ALenum local_40;
  uint local_3c;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar2;
  MP3D_PROGRESS_CB in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  local_3c = in_stack_ffffffffffffffe0;
  iVar1 = mp3dec_load((mp3dec_t *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (mp3dec_file_info_t *)
                      CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd0,
                      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (iVar1 == 0) {
    uVar2 = in_stack_ffffffffffffffd8 * 2;
    local_40 = GetOpenALFormat((uint8_t)local_3c);
    local_44 = (float)uVar2 / ((float)in_stack_ffffffffffffffec * 1024.0);
    alGenBuffers(1,&local_48);
    alBufferData(local_48,local_40,in_stack_ffffffffffffffd0,uVar2,in_stack_ffffffffffffffe4);
    *in_RSI = local_48;
    *(undefined1 *)(in_RSI + 2) = 1;
    in_RSI[3] = local_44;
    alGenSources(1,in_RSI + 1);
    alSourcei(in_RSI[1],0x1009,local_48);
    printf("Loaded mp3 info:\n");
    printf("    Filename: %s\n",in_RDI);
    printf("    Channels: %d\n",(ulong)local_3c);
    printf("    Sample Rate: %d\n",(ulong)in_stack_ffffffffffffffe4);
    printf("    Size: %d bytes\n",(ulong)uVar2);
    printf("    Length: %f sec\n",(double)local_44);
    iVar1 = alGetError();
    if (iVar1 != 0) {
      fprintf(_stderr,"Failed to setup audio source!\n");
    }
  }
  else {
    fprintf(_stderr,"Can\'t load %s!\n",in_RDI);
    *(undefined1 *)(in_RSI + 2) = 0;
  }
  return;
}

Assistant:

void VxSndLoadSound(const char* filename, AudioSource* const source) {
    mp3dec_file_info_t info;
    if (mp3dec_load(&mp3Dec, filename, &info, NULL, NULL)) {
        fprintf(stderr, "Can't load %s!\n", filename);
        source->loaded = false;
        return;
    }
    uint32_t size = info.samples * sizeof(mp3d_sample_t);

    int sampleRate = info.hz;
    int channels = info.channels;
    int alFormat = GetOpenALFormat(channels);
    float lengthSeconds = size / (info.avg_bitrate_kbps * 1024.0f);

    ALuint buffer;
    alGenBuffers(1, &buffer);
    alBufferData(buffer, alFormat, info.buffer, size, sampleRate);

    source->bufferId = buffer;
    source->loaded = true;
    source->length = lengthSeconds;

    alGenSources(1, &source->sourceId);
    alSourcei(source->sourceId, AL_BUFFER, buffer);

    printf("Loaded mp3 info:\n");
    printf("    Filename: %s\n", filename);
    printf("    Channels: %d\n", channels);
    printf("    Sample Rate: %d\n", sampleRate);
    printf("    Size: %d bytes\n", size);
    printf("    Length: %f sec\n", lengthSeconds);

    if (alGetError() != AL_NO_ERROR) {
        fprintf(stderr, "Failed to setup audio source!\n");
    }
}